

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,false,true>
               (dtime_t *ldata,interval_t *rdata,dtime_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  long lVar2;
  dtime_t *pdVar3;
  dtime_t *pdVar4;
  dtime_t dVar5;
  dtime_t dVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_7c;
  dtime_t *local_78;
  interval_t *local_70;
  undefined4 local_68;
  undefined4 local_64;
  dtime_t *local_60;
  ulong local_58;
  ulong local_50;
  ValidityMask *local_48;
  ulong local_40;
  dtime_t local_38;
  
  local_78 = result_data;
  local_70 = rdata;
  local_48 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar5.micros._0_4_ = rdata->months;
      dVar5.micros._4_4_ = rdata->days;
      iVar10 = 0;
      lVar2 = rdata->micros;
      do {
        local_64 = 0;
        right_01.micros = (int64_t)&local_64;
        right_01._0_8_ = -lVar2;
        dVar6 = Interval::Add((Interval *)ldata[iVar10].micros,dVar5,right_01,(date_t *)mask);
        local_78[iVar10].micros = dVar6.micros;
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_40 = 0;
    uVar8 = 0;
    local_60 = ldata;
    local_50 = count;
    do {
      pdVar4 = local_60;
      pdVar3 = local_78;
      puVar1 = (local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar1[local_40];
      }
      uVar11 = uVar8 + 0x40;
      if (local_50 <= uVar8 + 0x40) {
        uVar11 = local_50;
      }
      uVar9 = uVar11;
      if (uVar7 != 0) {
        uVar9 = uVar8;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar8 < uVar11) {
            local_38.micros._0_4_ = local_70->months;
            local_38.micros._4_4_ = local_70->days;
            lVar2 = local_70->micros;
            do {
              local_7c = 0;
              right.micros = (int64_t)&local_7c;
              right._0_8_ = -lVar2;
              dVar5 = Interval::Add((Interval *)pdVar4[uVar8].micros,local_38,right,(date_t *)mask);
              pdVar3[uVar8].micros = dVar5.micros;
              uVar8 = uVar8 + 1;
              uVar9 = uVar8;
            } while (uVar11 != uVar8);
          }
        }
        else if (uVar8 < uVar11) {
          uVar9 = 0;
          do {
            if ((uVar7 >> (uVar9 & 0x3f) & 1) != 0) {
              dVar6.micros._0_4_ = local_70->months;
              dVar6.micros._4_4_ = local_70->days;
              local_68 = 0;
              right_00.micros = (int64_t)&local_68;
              right_00._0_8_ = -local_70->micros;
              dVar5 = Interval::Add((Interval *)pdVar4[uVar8 + uVar9].micros,dVar6,right_00,
                                    (date_t *)mask);
              pdVar3[uVar8 + uVar9].micros = dVar5.micros;
            }
            uVar9 = uVar9 + 1;
          } while ((uVar8 - uVar11) + uVar9 != 0);
          uVar9 = uVar8 + uVar9;
        }
      }
      local_40 = local_40 + 1;
      uVar8 = uVar9;
    } while (local_40 != local_58);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}